

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vline.h
# Opt level: O0

void __thiscall VLine::splitAtLength(VLine *this,float lengthAt,VLine *left,VLine *right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *in_RDX;
  float *in_RSI;
  VLine *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float dy;
  float dx;
  float len;
  
  fVar5 = length(in_RDI);
  fVar1 = in_RDI->mX2;
  fVar2 = in_RDI->mX1;
  fVar3 = in_RDI->mY2;
  fVar4 = in_RDI->mY1;
  *in_RSI = in_RDI->mX1;
  in_RSI[1] = in_RDI->mY1;
  in_RSI[2] = *in_RSI + ((fVar1 - fVar2) / fVar5) * in_XMM0_Da;
  in_RSI[3] = in_RSI[1] + ((fVar3 - fVar4) / fVar5) * in_XMM0_Da;
  *in_RDX = in_RSI[2];
  in_RDX[1] = in_RSI[3];
  in_RDX[2] = in_RDI->mX2;
  in_RDX[3] = in_RDI->mY2;
  return;
}

Assistant:

inline void VLine::splitAtLength(float lengthAt, VLine &left, VLine &right) const
{
    float  len = length();
    float dx = ((mX2 - mX1) / len) * lengthAt;
    float dy = ((mY2 - mY1) / len) * lengthAt;

    left.mX1 = mX1;
    left.mY1 = mY1;
    left.mX2 = left.mX1 + dx;
    left.mY2 = left.mY1 + dy;

    right.mX1 = left.mX2;
    right.mY1 = left.mY2;
    right.mX2 = mX2;
    right.mY2 = mY2;
}